

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O0

bool __thiscall Minefield::isMine(Minefield *this,int x,int y)

{
  bool bVar1;
  runtime_error *this_00;
  reference this_01;
  reference local_38 [2];
  int local_18;
  int local_14;
  int y_local;
  int x_local;
  Minefield *this_local;
  
  local_18 = y;
  local_14 = x;
  _y_local = this;
  checkPos(this,x,y);
  bVar1 = isGameRunning(this);
  if ((bVar1) && (bVar1 = isOpen(this,local_14,local_18), !bVar1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Can\'t check if is mine on not-opened field.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = std::
            vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ::operator[](&this->mines,(long)local_14);
  local_38[0] = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,(long)local_18);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(local_38);
  return bVar1;
}

Assistant:

bool Minefield::isMine(int x, int y) {
    checkPos(x, y);
    if (isGameRunning() && ! isOpen(x, y)) {
        throw std::runtime_error("Can't check if is mine on not-opened field.");
    }

    return mines[x][y];
}